

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::CanGetAddresses(LegacyScriptPubKeyMan *this,bool internal)

{
  WalletStorage *pWVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  if (internal) {
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar3 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,0x2227c);
    if ((char)iVar3 != '\0') {
      sVar4 = (this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.super__Rb_tree_header.
              _M_node_count;
      goto LAB_00beb5ac;
    }
  }
  sVar4 = KeypoolCountExternalKeys(this);
LAB_00beb5ac:
  bVar2 = true;
  if (sVar4 == 0) {
    bVar2 = CanGenerateKeys(this);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::CanGetAddresses(bool internal) const
{
    LOCK(cs_KeyStore);
    // Check if the keypool has keys
    bool keypool_has_keys;
    if (internal && m_storage.CanSupportFeature(FEATURE_HD_SPLIT)) {
        keypool_has_keys = setInternalKeyPool.size() > 0;
    } else {
        keypool_has_keys = KeypoolCountExternalKeys() > 0;
    }
    // If the keypool doesn't have keys, check if we can generate them
    if (!keypool_has_keys) {
        return CanGenerateKeys();
    }
    return keypool_has_keys;
}